

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinuxReporters.cpp
# Opt level: O2

void __thiscall
ApprovalTests::Linux::SublimeMergeRepositoryPackageReporter::SublimeMergeRepositoryPackageReporter
          (SublimeMergeRepositoryPackageReporter *this)

{
  DiffInfo DStack_58;
  
  DiffPrograms::Linux::SUBLIME_MERGE_REPOSITORY_PACKAGE();
  GenericDiffReporter::GenericDiffReporter(&this->super_GenericDiffReporter,&DStack_58);
  DiffInfo::~DiffInfo(&DStack_58);
  (this->super_GenericDiffReporter).super_CommandReporter.super_Reporter._vptr_Reporter =
       (_func_int **)&PTR__GenericDiffReporter_001bcf68;
  SystemLauncher::setForeground(&(this->super_GenericDiffReporter).launcher,true);
  return;
}

Assistant:

SublimeMergeRepositoryPackageReporter::SublimeMergeRepositoryPackageReporter()
            : GenericDiffReporter(DiffPrograms::Linux::SUBLIME_MERGE_REPOSITORY_PACKAGE())
        {
            launcher.setForeground(true);
        }